

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_walks.cpp
# Opt level: O0

size_t handlegraph::algorithms::count_walks(HandleGraph *graph)

{
  bool bVar1;
  unsigned_long uVar2;
  mapped_type *pmVar3;
  handle_t *sink;
  iterator __end2;
  iterator __begin2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  size_t total_count;
  bool *overflowed;
  unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>
  *count;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *sinks;
  tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
  to_receive;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_ffffffffffffff28;
  unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>
  *in_stack_ffffffffffffff30;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_a0;
  __tuple_element_t<0UL,_tuple<vector<handle_t,_allocator<handle_t>_>,_unordered_map<handle_t,_unsigned_long,_hash<handlegraph::handle_t>,_equal_to<handle_t>,_allocator<pair<const_handle_t,_unsigned_long>_>_>,_bool>_>
  *local_98;
  char *local_90;
  undefined4 local_84;
  __tuple_element_t<2UL,_tuple<vector<handle_t,_allocator<handle_t>_>,_unordered_map<handle_t,_unsigned_long,_hash<handlegraph::handle_t>,_equal_to<handle_t>,_allocator<pair<const_handle_t,_unsigned_long>_>_>,_bool>_>
  *local_80;
  __tuple_element_t<1UL,_tuple<vector<handle_t,_allocator<handle_t>_>,_unordered_map<handle_t,_unsigned_long,_hash<handlegraph::handle_t>,_equal_to<handle_t>,_allocator<pair<const_handle_t,_unsigned_long>_>_>,_bool>_>
  *local_78;
  __tuple_element_t<0UL,_tuple<vector<handle_t,_allocator<handle_t>_>,_unordered_map<handle_t,_unsigned_long,_hash<handlegraph::handle_t>,_equal_to<handle_t>,_allocator<pair<const_handle_t,_unsigned_long>_>_>,_bool>_>
  *local_70;
  HandleGraph *in_stack_ffffffffffffffe8;
  char *local_8;
  
  count_walks_through_nodes(in_stack_ffffffffffffffe8);
  local_70 = std::
             get<0ul,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>,std::unordered_map<handlegraph::handle_t,unsigned_long,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<std::pair<handlegraph::handle_t_const,unsigned_long>>>,bool>
                       ((tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
                         *)0x258ddb);
  local_78 = std::
             get<1ul,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>,std::unordered_map<handlegraph::handle_t,unsigned_long,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<std::pair<handlegraph::handle_t_const,unsigned_long>>>,bool>
                       ((tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
                         *)0x258dea);
  local_80 = std::
             get<2ul,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>,std::unordered_map<handlegraph::handle_t,unsigned_long,std::hash<handlegraph::handle_t>,std::equal_to<handlegraph::handle_t>,std::allocator<std::pair<handlegraph::handle_t_const,unsigned_long>>>,bool>
                       ((tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
                         *)0x258df9);
  if ((*local_80 & 1U) == 0) {
    local_90 = (char *)0x0;
    local_98 = local_70;
    local_a0._M_current =
         (handle_t *)
         std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                   (in_stack_ffffffffffffff28);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
              (in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
      ::operator*(&local_a0);
      uVar2 = std::numeric_limits<unsigned_long>::max();
      in_stack_ffffffffffffff30 =
           (unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>
            *)(uVar2 - (long)local_90);
      pmVar3 = std::
               unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>
               ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
      if (in_stack_ffffffffffffff30 <
          (unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>
           *)*pmVar3) {
        local_8 = (char *)std::numeric_limits<unsigned_long>::max();
        goto LAB_00258f2c;
      }
      in_stack_ffffffffffffff28 =
           (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
           std::
           unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>
           ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
      local_90 = ((in_stack_ffffffffffffff28->
                  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>)
                  ._M_impl.super__Vector_impl_data._M_start)->data + (long)local_90;
      __gnu_cxx::
      __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
      ::operator++(&local_a0);
    }
    local_8 = local_90;
  }
  else {
    local_8 = (char *)std::numeric_limits<unsigned_long>::max();
  }
LAB_00258f2c:
  local_84 = 1;
  std::
  tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
  ::~tuple((tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
            *)0x258f36);
  return (size_t)local_8;
}

Assistant:

size_t count_walks(const HandleGraph* graph){
    
    tuple<vector<handle_t>, unordered_map<handle_t, size_t>, bool>  to_receive = count_walks_through_nodes(graph);
    
    vector<handle_t>& sinks = get<0>(to_receive);
    unordered_map<handle_t, size_t>& count = get<1>(to_receive);
    bool& overflowed = get<2>(to_receive);
    
    if (overflowed) {
        return numeric_limits<size_t>::max();
    }
    
    // total up the walks at the sinks
    size_t total_count = 0;
    for (handle_t& sink : sinks) {
        if (numeric_limits<size_t>::max() - total_count < count[sink]) {
            return numeric_limits<size_t>::max();
        }
        total_count += count[sink];
    }
    return total_count;
}